

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O2

Hcell * machineAtAddr(Hcell *__return_storage_ptr__,Machine *m,Addr a)

{
  int extraout_EAX;
  Hcell *pHVar1;
  char *in_R8;
  int in_R9D;
  key_type local_1c;
  
  if (a.tag_ == Heap) {
    local_1c.hix = (int)Addr::hix((Addr *)&stack0xffffffffffffffd8);
    pHVar1 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
             operator[](&m->heap,&local_1c);
  }
  else {
    if (a.tag_ != Reg) {
      __assert_fail("false && \"unreachable\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/bollu[P]warren-cpp/src/lzero.cpp"
                    ,0x104,"Hcell machineAtAddr(Machine, Addr)");
    }
    Addr::r((Addr *)&stack0xffffffffffffffd8,m,a._0_8_,a.hix_.hix.hix,in_R8,in_R9D,0);
    local_1c.hix = extraout_EAX;
    pHVar1 = std::
             map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
             ::operator[](&m->regval,(key_type *)&local_1c);
  }
  Hcell::Hcell(__return_storage_ptr__,pHVar1);
  return __return_storage_ptr__;
}

Assistant:

Hcell machineAtAddr(Machine m, Addr a) {
    switch (a.tag()) {
        case AddrTag::Reg:
            return m.regval[a.r()];
        case AddrTag::Heap:
            return m.heap[a.hix()];
    }
    assert(false && "unreachable");
}